

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float3x3 * ConvexDecomposition::Transpose(float3x3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float3x3 *in_RDI;
  
  fVar1 = (m->z).x;
  auVar5._0_4_ = (m->x).x;
  auVar5._4_4_ = (m->x).y;
  auVar5._8_4_ = (m->x).z;
  auVar5._12_4_ = (m->y).x;
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)(m->y).x),0x10);
  fVar2 = (m->z).y;
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])&(m->x).y,ZEXT416((uint)(m->y).y),0x10);
  fVar3 = (m->z).z;
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])&(m->x).z,ZEXT416((uint)(m->y).z),0x10);
  uVar4 = vmovlps_avx(auVar5);
  (in_RDI->x).x = (float)(int)uVar4;
  (in_RDI->x).y = (float)(int)((ulong)uVar4 >> 0x20);
  (in_RDI->x).z = fVar1;
  uVar4 = vmovlps_avx(auVar6);
  (in_RDI->y).x = (float)(int)uVar4;
  (in_RDI->y).y = (float)(int)((ulong)uVar4 >> 0x20);
  (in_RDI->y).z = fVar2;
  uVar4 = vmovlps_avx(auVar7);
  (in_RDI->z).x = (float)(int)uVar4;
  (in_RDI->z).y = (float)(int)((ulong)uVar4 >> 0x20);
  (in_RDI->z).z = fVar3;
  return in_RDI;
}

Assistant:

float3x3 Transpose( const float3x3& m )
{
	return float3x3( float3(m.x.x,m.y.x,m.z.x),
					float3(m.x.y,m.y.y,m.z.y),
					float3(m.x.z,m.y.z,m.z.z));
}